

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::EncodePath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  string local_48;
  undefined1 local_21;
  string *local_20;
  string *path_local;
  cmGlobalNinjaGenerator *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = path;
  path_local = (string *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  EncodeLiteral(&local_48,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__," ","$ ");
  cmsys::SystemTools::ReplaceString(__return_storage_ptr__,":","$:");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodePath(const std::string& path)
{
  std::string result = path;
#ifdef _WIN32
  if (this->IsGCCOnWindows())
    std::replace(result.begin(), result.end(), '\\', '/');
  else
    std::replace(result.begin(), result.end(), '/', '\\');
#endif
  result = EncodeLiteral(result);
  cmSystemTools::ReplaceString(result, " ", "$ ");
  cmSystemTools::ReplaceString(result, ":", "$:");
  return result;
}